

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaImpl::AddCleanup
          (ArenaImpl *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  CleanupChunk *pCVar2;
  CleanupChunk *pCVar3;
  ulong n;
  SerialArena *this_00;
  ulong uVar4;
  long *in_FS_OFFSET;
  
  if (in_FS_OFFSET[-2] == this->lifecycle_id_) {
    this_00 = (SerialArena *)in_FS_OFFSET[-1];
  }
  else {
    this_00 = (this->hint_)._M_b._M_p;
    if ((this_00 == (__pointer_type)0x0) || (this_00->owner_ != (void *)(*in_FS_OFFSET + -0x10))) {
      AddCleanupFallback(this,elem,cleanup);
      return;
    }
  }
  pCVar1 = this_00->cleanup_ptr_;
  if (pCVar1 == this_00->cleanup_limit_) {
    pCVar2 = this_00->cleanup_;
    do {
      if (pCVar2 == (CleanupChunk *)0x0) {
        uVar4 = 8;
      }
      else {
        uVar4 = pCVar2->size * 2;
        if (0x3f < uVar4) {
          uVar4 = 0x40;
        }
      }
      n = (ulong)((int)uVar4 * 0x10 + 0x17U & 0xff0);
      pCVar3 = (CleanupChunk *)this_00->ptr_;
      if ((ulong)((long)this_00->limit_ - (long)pCVar3) < n) {
        pCVar3 = (CleanupChunk *)SerialArena::AllocateAlignedFallback(this_00,n);
        pCVar2 = this_00->cleanup_;
      }
      else {
        this_00->ptr_ = (char *)((long)&((CleanupChunk *)(pCVar3->nodes + -1))->size + n);
      }
      pCVar3->next = pCVar2;
      pCVar3->size = uVar4;
      this_00->cleanup_ = pCVar3;
      this_00->cleanup_ptr_ = pCVar3->nodes;
      this_00->cleanup_limit_ = pCVar3->nodes + uVar4;
      pCVar2 = pCVar3;
    } while (uVar4 == 0);
    pCVar3->nodes[0].elem = elem;
    pCVar3->nodes[0].cleanup = cleanup;
    this_00->cleanup_ptr_ = (CleanupNode *)(pCVar3 + 1);
    return;
  }
  pCVar1->elem = elem;
  pCVar1->cleanup = cleanup;
  this_00->cleanup_ptr_ = pCVar1 + 1;
  return;
}

Assistant:

inline PROTOBUF_ALWAYS_INLINE bool ArenaImpl::GetSerialArenaFast(
    ArenaImpl::SerialArena** arena) {
  // If this thread already owns a block in this arena then try to use that.
  // This fast path optimizes the case where multiple threads allocate from the
  // same arena.
  ThreadCache* tc = &thread_cache();
  if (PROTOBUF_PREDICT_TRUE(tc->last_lifecycle_id_seen == lifecycle_id_)) {
    *arena = tc->last_serial_arena;
    return true;
  }

  // Check whether we own the last accessed SerialArena on this arena.  This
  // fast path optimizes the case where a single thread uses multiple arenas.
  SerialArena* serial = hint_.load(std::memory_order_acquire);
  if (PROTOBUF_PREDICT_TRUE(serial != NULL && serial->owner() == tc)) {
    *arena = serial;
    return true;
  }

  return false;
}